

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_improved_flip(integral_image *iimage,interest_point *ipoint)

{
  float *in_RSI;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float xs_sub_sample_x;
  int sample_x;
  int k;
  float ys_sub_sample_y;
  int sample_y;
  int l;
  int ys;
  int xs;
  float mdy;
  float mdx;
  float dy;
  float dx;
  int j;
  int i;
  float cy;
  float cx;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  float ipoint_y;
  float ipoint_x;
  int int_scale_mul_2;
  float scale_mul_25f;
  float scale;
  int local_a8;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  int local_70;
  int local_64;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  int local_48;
  int local_44;
  float local_38;
  int local_34;
  
  fVar6 = in_RSI[2];
  auVar22._8_4_ = 0x80000000;
  auVar22._0_8_ = 0x8000000080000000;
  auVar22._12_4_ = 0x80000000;
  auVar9._8_4_ = 0x3effffff;
  auVar9._0_8_ = 0x3effffff3effffff;
  auVar9._12_4_ = 0x3effffff;
  auVar1 = vpternlogd_avx512vl(auVar9,ZEXT416((uint)fVar6),auVar22,0xf8);
  vroundss_avx(ZEXT416((uint)fVar6),ZEXT416((uint)(fVar6 + auVar1._0_4_)),0xb);
  fVar3 = *in_RSI;
  auVar23._8_4_ = 0x80000000;
  auVar23._0_8_ = 0x8000000080000000;
  auVar23._12_4_ = 0x80000000;
  auVar2._8_4_ = 0x3effffff;
  auVar2._0_8_ = 0x3effffff3effffff;
  auVar2._12_4_ = 0x3effffff;
  auVar1 = vpternlogd_avx512vl(auVar2,ZEXT416((uint)fVar3),auVar23,0xf8);
  auVar1 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)(fVar3 + auVar1._0_4_)),0xb);
  auVar20._0_8_ = (double)auVar1._0_4_;
  auVar20._8_8_ = 0;
  auVar1._0_8_ = (double)fVar6;
  auVar1._8_8_ = 0;
  auVar9 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar1,auVar20);
  fVar3 = in_RSI[1];
  auVar24._8_4_ = 0x80000000;
  auVar24._0_8_ = 0x8000000080000000;
  auVar24._12_4_ = 0x80000000;
  auVar10._8_4_ = 0x3effffff;
  auVar10._0_8_ = 0x3effffff3effffff;
  auVar10._12_4_ = 0x3effffff;
  auVar1 = vpternlogd_avx512vl(auVar10,ZEXT416((uint)fVar3),auVar24,0xf8);
  auVar1 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)(fVar3 + auVar1._0_4_)),0xb);
  auVar21._0_8_ = (double)auVar1._0_4_;
  auVar21._8_8_ = 0;
  auVar7._0_8_ = (double)fVar6;
  auVar7._8_8_ = 0;
  auVar1 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar7,auVar21);
  local_34 = 0;
  local_38 = 0.0;
  for (local_44 = -8; local_44 < 8; local_44 = local_44 + 5) {
    for (local_48 = -8; local_48 < 8; local_48 = local_48 + 5) {
      local_4c = 0.0;
      local_50 = 0.0;
      local_54 = 0.0;
      local_58 = 0.0;
      auVar11._0_4_ = (float)local_44;
      auVar11._4_12_ = SUB6412(ZEXT1664((undefined1  [16])0x0),4);
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar6),auVar11,ZEXT416((uint)(float)auVar9._0_8_));
      auVar25._8_4_ = 0x80000000;
      auVar25._0_8_ = 0x8000000080000000;
      auVar25._12_4_ = 0x80000000;
      auVar12._8_4_ = 0x3effffff;
      auVar12._0_8_ = 0x3effffff3effffff;
      auVar12._12_4_ = 0x3effffff;
      auVar2 = vpternlogd_avx512vl(auVar12,auVar7,auVar25,0xf8);
      auVar7 = vroundss_avx(auVar7,ZEXT416((uint)(auVar7._0_4_ + auVar2._0_4_)),0xb);
      auVar13._0_4_ = (float)local_48;
      auVar13._4_12_ = auVar7._4_12_;
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar6),auVar13,ZEXT416((uint)(float)auVar1._0_8_));
      auVar26._8_4_ = 0x80000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar26._12_4_ = 0x80000000;
      auVar14._8_4_ = 0x3effffff;
      auVar14._0_8_ = 0x3effffff3effffff;
      auVar14._12_4_ = 0x3effffff;
      auVar2 = vpternlogd_avx512vl(auVar14,auVar7,auVar26,0xf8);
      auVar7 = vroundss_avx(auVar7,ZEXT416((uint)(auVar7._0_4_ + auVar2._0_4_)),0xb);
      auVar8 = ZEXT1664(auVar7);
      for (local_64 = local_48 + -4; local_64 < local_48 + 5; local_64 = local_64 + 1) {
        auVar15._0_4_ = (float)local_64;
        auVar15._4_12_ = auVar8._4_12_;
        auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar6),auVar15,ZEXT416((uint)(float)auVar1._0_8_));
        auVar27._8_4_ = 0x80000000;
        auVar27._0_8_ = 0x8000000080000000;
        auVar27._12_4_ = 0x80000000;
        auVar16._8_4_ = 0x3effffff;
        auVar16._0_8_ = 0x3effffff3effffff;
        auVar16._12_4_ = 0x3effffff;
        auVar2 = vpternlogd_avx512vl(auVar16,auVar7,auVar27,0xf8);
        vroundss_avx(auVar7,ZEXT416((uint)(auVar7._0_4_ + auVar2._0_4_)),0xb);
        for (local_70 = local_44 + -4; auVar8 = ZEXT464(0), local_70 < local_44 + 5;
            local_70 = local_70 + 1) {
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)(float)local_70),
                                   ZEXT416((uint)(float)auVar9._0_8_));
          auVar28._8_4_ = 0x80000000;
          auVar28._0_8_ = 0x8000000080000000;
          auVar28._12_4_ = 0x80000000;
          auVar17._8_4_ = 0x3effffff;
          auVar17._0_8_ = 0x3effffff3effffff;
          auVar17._12_4_ = 0x3effffff;
          auVar2 = vpternlogd_avx512vl(auVar17,auVar7,auVar28,0xf8);
          vroundss_avx(auVar7,ZEXT416((uint)(auVar7._0_4_ + auVar2._0_4_)),0xb);
          fVar3 = gaussianf(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff5c);
          fVar4 = haarX_improved((integral_image *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                 (int)in_stack_ffffffffffffff6c,(int)in_stack_ffffffffffffff68,
                                 (int)in_stack_ffffffffffffff64);
          fVar5 = haarY_improved((integral_image *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                 (int)in_stack_ffffffffffffff6c,(int)in_stack_ffffffffffffff68,
                                 (int)in_stack_ffffffffffffff64);
          in_stack_ffffffffffffff74 = fVar3 * fVar4;
          local_4c = fVar3 * fVar5 + local_4c;
          local_50 = in_stack_ffffffffffffff74 + local_50;
          auVar18._8_4_ = 0x7fffffff;
          auVar18._0_8_ = 0x7fffffff7fffffff;
          auVar18._12_4_ = 0x7fffffff;
          auVar7 = vpand_avx(ZEXT416((uint)(fVar3 * fVar5)),auVar18);
          local_54 = auVar7._0_4_ + local_54;
          auVar19._8_4_ = 0x7fffffff;
          auVar19._0_8_ = 0x7fffffff7fffffff;
          auVar19._12_4_ = 0x7fffffff;
          auVar7 = vpand_avx(ZEXT416((uint)in_stack_ffffffffffffff74),auVar19);
          local_58 = auVar7._0_4_ + local_58;
        }
      }
      in_stack_ffffffffffffff70 =
           gaussianf(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      in_stack_ffffffffffffff6c = local_4c * in_stack_ffffffffffffff70;
      in_stack_ffffffffffffff68 = local_50 * in_stack_ffffffffffffff70;
      in_stack_ffffffffffffff64 = local_54 * in_stack_ffffffffffffff70;
      in_stack_ffffffffffffff60 = local_58 * in_stack_ffffffffffffff70;
      in_RSI[(long)local_34 + 5] = in_stack_ffffffffffffff6c;
      in_RSI[(long)(local_34 + 1) + 5] = in_stack_ffffffffffffff68;
      in_RSI[(long)(local_34 + 2) + 5] = in_stack_ffffffffffffff64;
      in_RSI[(long)(local_34 + 3) + 5] = in_stack_ffffffffffffff60;
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff6c),
                               ZEXT416((uint)in_stack_ffffffffffffff6c),
                               ZEXT416((uint)(in_stack_ffffffffffffff68 * in_stack_ffffffffffffff68)
                                      ));
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff64),
                               ZEXT416((uint)in_stack_ffffffffffffff64),auVar7);
      auVar7 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffff60),
                               ZEXT416((uint)in_stack_ffffffffffffff60),auVar7);
      local_38 = auVar7._0_4_ + local_38;
      local_34 = local_34 + 4;
    }
  }
  fVar6 = sqrtf(local_38);
  for (local_a8 = 0; local_a8 < 0x40; local_a8 = local_a8 + 1) {
    in_RSI[(long)local_a8 + 5] = (1.0 / fVar6) * in_RSI[(long)local_a8 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_improved_flip(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - same as get_msurf_descriptor_improved
        - switched order of inner loops to go along x direction for better locality
    */

    float scale = ipoint->scale;
    float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;

                    //Get the gaussian weighted x and y responses
                    // TODO: (Sebastian) Precompute this...
                    float gauss_s1 = gaussianf(xs_sub_sample_x, ys_sub_sample_y, scale_mul_25f);
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // TODO: (Sebastian) Precompute this...
            float gauss_s2 = gaussianf(cx, cy, 1.5f);

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}